

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

SignWithPrivkeyRequestStruct * __thiscall
cfd::js::api::json::SignWithPrivkeyRequest::ConvertToStruct
          (SignWithPrivkeyRequestStruct *__return_storage_ptr__,SignWithPrivkeyRequest *this)

{
  _Rb_tree_header *p_Var1;
  vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_> local_198;
  undefined1 local_178 [72];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [40];
  int64_t iStack_c8;
  string local_c0 [32];
  bool local_a0;
  string asStack_98 [32];
  string local_78 [40];
  _Rb_tree_node_base local_50;
  size_t local_30;
  
  __return_storage_ptr__->is_elements = false;
  (__return_storage_ptr__->tx)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->tx).field_2;
  (__return_storage_ptr__->tx)._M_string_length = 0;
  (__return_storage_ptr__->tx).field_2._M_local_buf[0] = '\0';
  SignWithPrivkeyTxInRequestStruct::SignWithPrivkeyTxInRequestStruct(&__return_storage_ptr__->txin);
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->is_elements = this->is_elements_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->tx);
  SignWithPrivkeyTxInRequest::ConvertToStruct
            ((SignWithPrivkeyTxInRequestStruct *)local_178,&this->txin_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->txin,(string *)local_178);
  (__return_storage_ptr__->txin).vout = local_178._32_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->txin).privkey,(string *)(local_178 + 0x28));
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->txin).pubkey,local_130);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->txin).hash_type,local_110);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->txin).sighash_type,local_f0);
  (__return_storage_ptr__->txin).sighash_anyone_can_pay = (bool)local_f0[0x20];
  (__return_storage_ptr__->txin).sighash_rangeproof = (bool)local_f0[0x21];
  (__return_storage_ptr__->txin).field_0xaa = local_f0[0x22];
  (__return_storage_ptr__->txin).field_0xab = local_f0[0x23];
  (__return_storage_ptr__->txin).field_0xac = local_f0[0x24];
  (__return_storage_ptr__->txin).field_0xad = local_f0[0x25];
  (__return_storage_ptr__->txin).field_0xae = local_f0[0x26];
  (__return_storage_ptr__->txin).field_0xaf = local_f0[0x27];
  (__return_storage_ptr__->txin).amount = iStack_c8;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->txin).confidential_value_commitment,local_c0);
  (__return_storage_ptr__->txin).is_grind_r = local_a0;
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->txin).aux_rand,asStack_98);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->txin).annex,local_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->txin).ignore_items._M_t);
  if (local_50._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_50._M_color;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_50._M_parent;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = local_50._M_left;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_50._M_right;
    (local_50._M_parent)->_M_parent =
         &(__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_30;
    local_50._M_parent = (_Base_ptr)0x0;
    local_30 = 0;
    local_50._M_left = &local_50;
    local_50._M_right = &local_50;
  }
  SignWithPrivkeyTxInRequestStruct::~SignWithPrivkeyTxInRequestStruct
            ((SignWithPrivkeyTxInRequestStruct *)local_178);
  core::JsonObjectVector<cfd::js::api::json::UtxoObject,_cfd::js::api::UtxoObjectStruct>::
  ConvertToStruct(&local_198,&this->utxos_);
  local_178._16_8_ =
       (__return_storage_ptr__->utxos).
       super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_198.
       super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_178._0_8_ =
       (__return_storage_ptr__->utxos).
       super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_178._8_8_ =
       (__return_storage_ptr__->utxos).
       super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_198.
       super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_198.
       super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_198.
  super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>::
  ~vector((vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_> *
          )local_178);
  std::vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>::
  ~vector(&local_198);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

SignWithPrivkeyRequestStruct SignWithPrivkeyRequest::ConvertToStruct() const {  // NOLINT
  SignWithPrivkeyRequestStruct result;
  result.is_elements = is_elements_;
  result.tx = tx_;
  result.txin = txin_.ConvertToStruct();
  result.utxos = utxos_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}